

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O3

uchar * base64_decode(char *data,size_t input_length,size_t *output_length)

{
  int i;
  char *pcVar1;
  long lVar2;
  uchar *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  size_t __size;
  
  pcVar1 = decoding_table;
  if (decoding_table == (char *)0x0) {
    pcVar1 = (char *)malloc(0x100);
    lVar2 = 0;
    decoding_table = pcVar1;
    do {
      pcVar1[(byte)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar2]] =
           (char)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
  }
  if ((input_length & 3) == 0) {
    __size = (input_length >> 2) * 3;
    *output_length = __size;
    if (data[input_length - 1] == '=') {
      __size = __size - 1;
      *output_length = __size;
    }
    if (data[input_length - 2] == '=') {
      __size = __size - 1;
      *output_length = __size;
    }
    puVar3 = (uchar *)malloc(__size);
    if (puVar3 != (uchar *)0x0) {
      if (input_length == 0) {
        return puVar3;
      }
      uVar4 = 0;
      iVar5 = 0;
      do {
        iVar7 = 0;
        if ((long)data[uVar4] != 0x3d) {
          iVar7 = (int)pcVar1[data[uVar4]] << 0x12;
        }
        iVar9 = 0;
        iVar6 = 0;
        if ((long)data[uVar4 + 1] != 0x3d) {
          iVar6 = (int)pcVar1[data[uVar4 + 1]] << 0xc;
        }
        if ((long)data[uVar4 + 2] != 0x3d) {
          iVar9 = (int)pcVar1[data[uVar4 + 2]] << 6;
        }
        iVar10 = 0;
        if ((long)data[uVar4 + 3] != 0x3d) {
          iVar10 = (int)pcVar1[data[uVar4 + 3]];
        }
        iVar7 = iVar6 + iVar7 + iVar9 + iVar10;
        uVar8 = (ulong)iVar5;
        if (uVar8 < __size) {
          iVar5 = iVar5 + 1;
          puVar3[uVar8] = (uchar)((uint)iVar7 >> 0x10);
          uVar8 = (ulong)iVar5;
        }
        if (uVar8 < __size) {
          iVar5 = iVar5 + 1;
          puVar3[uVar8] = (uchar)((uint)iVar7 >> 8);
          uVar8 = (ulong)iVar5;
        }
        if (uVar8 < __size) {
          iVar5 = iVar5 + 1;
          puVar3[uVar8] = (uchar)iVar7;
        }
        uVar4 = uVar4 + 4;
      } while (uVar4 < input_length);
      return puVar3;
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *base64_decode(const char *data,
                             size_t input_length,
                             size_t *output_length) {

    if (decoding_table == NULL) build_decoding_table();

    if (input_length % 4 != 0) return NULL;

    *output_length = input_length / 4 * 3;
    if (data[input_length - 1] == '=') (*output_length)--;
    if (data[input_length - 2] == '=') (*output_length)--;

    unsigned char *decoded_data = malloc(*output_length);
    if (decoded_data == NULL) return NULL;

    for (int i = 0, j = 0; i < input_length;) {

        uint32_t sextet_a = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_b = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_c = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_d = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];

        uint32_t triple = (sextet_a << 3 * 6)
        + (sextet_b << 2 * 6)
        + (sextet_c << 1 * 6)
        + (sextet_d << 0 * 6);

        if (j < *output_length) decoded_data[j++] = (triple >> 2 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 1 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 0 * 8) & 0xFF;
    }

    return decoded_data;
}